

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strutil.cpp
# Opt level: O1

int test_strutil_trimcustom(ITesting *t)

{
  int iVar1;
  kTRContinueMode kVar2;
  string *__str;
  string str;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"   \"dump\"  ","");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38," \"\n","");
  __str = trun::trim(&local_58,&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_58,__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"dump");
  if (iVar1 != 0) {
    kVar2 = (*t->AssertError)(0x3e,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                              ,"str == \"dump\"");
    if (kVar2 == kTRLeave) {
      iVar1 = 0x10;
      goto LAB_0016a5ab;
    }
  }
  iVar1 = 0;
LAB_0016a5ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

DLL_EXPORT int test_strutil_trimcustom(ITesting *t) {
    std::string str("   \"dump\"  ");
    str = trun::trim(str, " \"\n");
    TR_ASSERT(t,str == "dump");
    return kTR_Pass;
}